

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void BeginMode2D(Camera2D camera)

{
  Camera2D camera_00;
  Matrix *pMVar1;
  float16 result;
  float local_88 [10];
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  
  rlDrawRenderBatch(RLGL.currentBatch);
  pMVar1 = RLGL.State.currentMatrix;
  (RLGL.State.currentMatrix)->m0 = 1.0;
  pMVar1->m4 = 0.0;
  pMVar1->m8 = 0.0;
  pMVar1->m12 = 0.0;
  pMVar1->m1 = 0.0;
  pMVar1->m5 = 1.0;
  pMVar1->m9 = 0.0;
  pMVar1->m13 = 0.0;
  pMVar1->m2 = 0.0;
  pMVar1->m6 = 0.0;
  pMVar1->m10 = 1.0;
  pMVar1->m14 = 0.0;
  pMVar1->m3 = 0.0;
  pMVar1->m7 = 0.0;
  pMVar1->m11 = 0.0;
  pMVar1->m15 = 1.0;
  camera_00.offset.y = (float)in_stack_ffffffffffffffa4;
  camera_00.offset.x = (float)in_stack_ffffffffffffffa0;
  camera_00.target.x = (float)in_stack_ffffffffffffffa8;
  camera_00.target.y = (float)in_stack_ffffffffffffffac;
  camera_00.rotation = (float)in_stack_ffffffffffffffb0;
  camera_00.zoom = in_stack_ffffffffffffffb4;
  GetCameraMatrix2D(camera_00);
  rlMultMatrixf(local_88);
  return;
}

Assistant:

void BeginMode2D(Camera2D camera)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlLoadIdentity();               // Reset current matrix (modelview)

    // Apply 2d camera transformation to modelview
    rlMultMatrixf(MatrixToFloat(GetCameraMatrix2D(camera)));
}